

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint32_t roaring_uint32_iterator_read(roaring_uint32_iterator_t *it,uint32_t *buf,uint32_t count)

{
  _Bool _Var1;
  _Bool _Var2;
  ulong uVar3;
  uint uVar4;
  uint16_t low16;
  uint32_t local_3c;
  uint local_38;
  uint32_t consumed;
  
  uVar4 = 0;
  local_38 = count;
  while( true ) {
    if (it->has_value != true) {
      return uVar4;
    }
    if (local_38 < uVar4 || local_38 - uVar4 == 0) break;
    low16 = (uint16_t)it->current_value;
    _Var1 = container_iterator_read_into_uint32
                      (it->container,it->typecode,&it->container_it,it->highbits,buf,
                       local_38 - uVar4,&consumed,&low16);
    uVar3 = (ulong)consumed;
    uVar4 = uVar4 + consumed;
    if (_Var1) {
      it->has_value = true;
      it->current_value = (uint)low16 | it->highbits;
      local_3c = uVar4;
    }
    else {
      it->container_index = it->container_index + 1;
      _Var2 = loadfirstvalue(it);
      it->has_value = _Var2;
    }
    buf = buf + uVar3;
    if (_Var1) {
      return local_3c;
    }
  }
  return uVar4;
}

Assistant:

uint32_t roaring_uint32_iterator_read(roaring_uint32_iterator_t *it,
                                      uint32_t *buf, uint32_t count) {
    uint32_t ret = 0;
    while (it->has_value && ret < count) {
        uint32_t consumed;
        uint16_t low16 = (uint16_t)it->current_value;
        bool has_value = container_iterator_read_into_uint32(
            it->container, it->typecode, &it->container_it, it->highbits, buf,
            count - ret, &consumed, &low16);
        ret += consumed;
        buf += consumed;
        if (has_value) {
            it->has_value = true;
            it->current_value = it->highbits | low16;
            assert(ret == count);
            return ret;
        }
        it->container_index++;
        it->has_value = loadfirstvalue(it);
    }
    return ret;
}